

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O0

void __thiscall gui::ChatBox::setSizeWithinBounds(ChatBox *this,Vector2f *size)

{
  float fVar1;
  float *pfVar2;
  ChatBox *in_RSI;
  long in_RDI;
  Vector2<unsigned_long> sizeCharacters;
  float charWidth;
  float charWidthFirst;
  FloatRect bounds2;
  FloatRect bounds1;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Text *in_stack_ffffffffffffff00;
  locale *this_00;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  Vector2<unsigned_long> local_a8;
  float local_98;
  float local_94;
  FloatRect local_90;
  locale local_80 [44];
  FloatRect local_54;
  locale local_38 [32];
  Vector2<unsigned_long> *in_stack_ffffffffffffffe8;
  
  std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x17c050);
  this_00 = local_38;
  std::locale::locale(this_00);
  sf::String::String((String *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),this_00);
  sf::Text::setString(in_stack_ffffffffffffff00,
                      (String *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  sf::String::~String((String *)0x17c0a9);
  std::locale::~locale(local_38);
  std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x17c0cc);
  local_54 = sf::Text::getLocalBounds
                       ((Text *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x17c0f7);
  std::locale::locale(local_80);
  sf::String::String((String *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),this_00);
  sf::Text::setString(in_stack_ffffffffffffff00,
                      (String *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  sf::String::~String((String *)0x17c150);
  std::locale::~locale(local_80);
  std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x17c16e);
  local_90 = sf::Text::getLocalBounds
                       ((Text *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_94 = local_54.left + local_54.width;
  local_98 = (local_90.left + local_90.width) - local_94;
  sf::Vector2<unsigned_long>::Vector2(&local_a8);
  fVar1 = *(float *)&(in_RSI->super_Widget).super_Drawable._vptr_Drawable;
  if ((fVar1 != *(float *)(in_RDI + 700)) || (NAN(fVar1) || NAN(*(float *)(in_RDI + 700)))) {
    std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x17c2b8);
    pfVar2 = std::max<float>((float *)&stack0xffffffffffffff54,(float *)&stack0xffffffffffffff50);
    local_a8.x = (unsigned_long)*pfVar2;
    local_a8.x = local_a8.x | (long)(*pfVar2 - 9.223372e+18) & (long)local_a8.x >> 0x3f;
  }
  else {
    local_a8.x = *(ulong *)(in_RDI + 0x2a0);
  }
  fVar1 = *(float *)((long)&(in_RSI->super_Widget).super_Drawable._vptr_Drawable + 4);
  if ((fVar1 != *(float *)(in_RDI + 0x2c0)) || (NAN(fVar1) || NAN(*(float *)(in_RDI + 0x2c0)))) {
    std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x17c38e);
    std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x17c3b4);
    std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x17c3cc);
    ChatBoxStyle::getCharacterSize((ChatBoxStyle *)0x17c3d4);
    pfVar2 = std::max<float>((float *)&stack0xffffffffffffff4c,(float *)&stack0xffffffffffffff48);
    local_a8.y = (unsigned_long)*pfVar2;
    local_a8.y = local_a8.y | (long)(*pfVar2 - 9.223372e+18) & (long)local_a8.y >> 0x3f;
  }
  else {
    local_a8.y = *(ulong *)(in_RDI + 0x2a8);
  }
  setSizeCharacters(in_RSI,in_stack_ffffffffffffffe8);
  *(_func_int ***)(in_RDI + 700) = (in_RSI->super_Widget).super_Drawable._vptr_Drawable;
  return;
}

Assistant:

void ChatBox::setSizeWithinBounds(const sf::Vector2f& size) {
    style_->text_.setString("A");
    const auto bounds1 = style_->text_.getLocalBounds();
    style_->text_.setString("AA");
    const auto bounds2 = style_->text_.getLocalBounds();

    // The first character may have some extra spacing, so figure out the actual width of each one.
    const auto charWidthFirst = bounds1.left + bounds1.width;
    const auto charWidth = bounds2.left + bounds2.width - charWidthFirst;

    sf::Vector2<size_t> sizeCharacters;
    if (size.x == size_.x) {
        sizeCharacters.x = sizeCharacters_.x;
    } else {
        sizeCharacters.x = static_cast<size_t>(std::max((size.x - 2.0f * style_->textPadding_.x - charWidthFirst + charWidth) / charWidth, 0.0f));
    }
    if (size.y == size_.y) {
        sizeCharacters.y = sizeCharacters_.y;
    } else {
        sizeCharacters.y = static_cast<size_t>(std::max((size.y - 2.0f * style_->textPadding_.y) / (style_->textPadding_.z * style_->getCharacterSize()), 0.0f));
    }
    setSizeCharacters(sizeCharacters);
    size_ = size;
}